

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.h
# Opt level: O2

void __thiscall
DumpWrapperToFileCommand::wrapperAction(DumpWrapperToFileCommand *this,ExeElementWrapper *wrapper)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  QString fileName;
  string local_38;
  
  if (wrapper != (ExeElementWrapper *)0x0) {
    iVar1 = (*(wrapper->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x11])(wrapper);
    makeFileName(&fileName,this,CONCAT44(extraout_var,iVar1));
    AbstractFileBuffer::dump(&fileName,&wrapper->super_AbstractByteBuffer,true);
    poVar2 = std::operator<<((ostream *)&std::cout,"Dumped size: ");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::operator<<(poVar2,"0x");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," into: ");
    QString::toStdString_abi_cxx11_(&local_38,&fileName);
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&fileName.d);
  }
  return;
}

Assistant:

virtual void wrapperAction(ExeElementWrapper *wrapper)
    {
        if (!wrapper) {
            return;
        }
        QString fileName = makeFileName(wrapper->getOffset());
        bufsize_t dSize = FileBuffer::dump(fileName, *wrapper, true);
        std::cout << "Dumped size: " << std::hex << "0x" << dSize 
            << " into: " << fileName.toStdString()
            << std::endl;
    }